

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

void roaring64_bitmap_remove_bulk
               (roaring64_bitmap_t *r,roaring64_bulk_context_t *context,uint64_t val)

{
  int iVar1;
  ulong uVar2;
  ulong *puVar3;
  art_val_t *leaf_00;
  int *c;
  int *piVar4;
  long lVar5;
  byte bVar6;
  uint8_t typecode;
  uint8_t typecode2;
  uint8_t high48 [6];
  leaf_t leaf;
  byte local_39;
  uint local_38;
  ushort local_34;
  ulong local_30;
  
  local_38 = (uint)(byte)(val >> 0x38) | ((uint)(val >> 0x20) & 0xff0000) >> 8 |
             (uint)(val >> 0x18) & 0xff0000 | (uint)(val >> 8) & 0xff000000;
  local_34 = (ushort)(val >> 0x18) & 0xff | (ushort)(val >> 8) & 0xff00;
  if ((context->leaf == (ulong *)0x0) ||
     (*(ushort *)(context->high_bytes + 4) != local_34 || *(uint *)context->high_bytes != local_38))
  {
    leaf_00 = art_find(&r->art,(art_key_chunk_t *)&local_38);
    containerptr_roaring64_bitmap_remove(r,(uint8_t *)&local_38,(uint16_t)val,leaf_00);
    context->leaf = leaf_00;
    *(uint *)context->high_bytes = local_38;
    *(ushort *)(context->high_bytes + 4) = local_34;
  }
  else {
    uVar2 = *context->leaf;
    piVar4 = (int *)r->containers[uVar2 >> 8];
    typecode = (uint8_t)uVar2;
    c = (int *)container_remove(piVar4,(uint16_t)val,typecode,&local_39);
    if (c != piVar4) {
      container_free(piVar4,typecode);
      puVar3 = context->leaf;
      uVar2 = *puVar3;
      r->containers[uVar2 >> 8] = c;
      *puVar3 = uVar2 & 0xffffffffffffff00 | (ulong)local_39;
    }
    piVar4 = c;
    bVar6 = local_39;
    if (local_39 == 4) {
      bVar6 = *(byte *)(c + 2);
      piVar4 = *(int **)c;
    }
    iVar1 = *piVar4;
    if ((bVar6 == 3) || (bVar6 == 2)) {
      if (0 < iVar1) {
        return;
      }
    }
    else if (iVar1 != 0) {
      if (iVar1 != -1) {
        return;
      }
      lVar5 = 0;
      do {
        if (*(long *)(*(long *)(piVar4 + 2) + lVar5 * 8) != 0) {
          return;
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x400);
    }
    container_free(c,local_39);
    art_erase(&r->art,(art_key_chunk_t *)&local_38,&local_30);
    local_30 = local_30 >> 8;
    r->containers[local_30] = (container_t *)0x0;
    if (local_30 < r->first_free) {
      r->first_free = local_30;
    }
  }
  return;
}

Assistant:

void roaring64_bitmap_remove_bulk(roaring64_bitmap_t *r,
                                  roaring64_bulk_context_t *context,
                                  uint64_t val) {
    art_t *art = &r->art;
    uint8_t high48[ART_KEY_BYTES];
    uint16_t low16 = split_key(val, high48);
    if (context->leaf != NULL &&
        compare_high48(context->high_bytes, high48) == 0) {
        // We're at a container with the correct high bits.
        uint8_t typecode = get_typecode(*context->leaf);
        container_t *container = get_container(r, *context->leaf);
        uint8_t typecode2;
        container_t *container2 =
            container_remove(container, low16, typecode, &typecode2);
        if (container2 != container) {
            container_free(container, typecode);
            replace_container(r, context->leaf, container2, typecode2);
        }
        if (!container_nonzero_cardinality(container2, typecode2)) {
            container_free(container2, typecode2);
            leaf_t leaf;
            bool erased = art_erase(art, high48, (art_val_t *)&leaf);
            assert(erased);
            remove_container(r, leaf);
        }
    } else {
        // We're not positioned anywhere yet or the high bits of the key
        // differ.
        leaf_t *leaf = (leaf_t *)art_find(art, high48);
        containerptr_roaring64_bitmap_remove(r, high48, low16, leaf);
        context->leaf = leaf;
        memcpy(context->high_bytes, high48, ART_KEY_BYTES);
    }
}